

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O1

Expression *
slang::ast::IntegerLiteral::fromSyntax(Compilation *comp,LiteralExpressionSyntax *syntax)

{
  Type *args_1;
  IntegerLiteral *pIVar1;
  SVInt val;
  bool local_39;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  uint local_30;
  char local_2c;
  byte local_2b;
  SourceRange local_28;
  undefined1 auVar2 [14];
  
  parsing::Token::intValue((Token *)&local_38);
  if ((local_30 < 0x20) || ((int)(comp->options).languageVersion < 1)) {
    SVInt::resize((SVInt *)&local_28,(bitwidth_t)&local_38);
    local_28._0_14_ = auVar2;
    SVInt::operator=((SVInt *)&local_38,(SVInt *)&local_28);
    if (((0x40 < (uint)local_28.endLoc._0_4_) ||
        (((undefined1  [14])local_28._0_14_ & (undefined1  [14])0x10000000000) !=
         (undefined1  [14])0x0)) && (local_28.startLoc != (SourceLocation)0x0)) {
      operator_delete__((void *)local_28.startLoc);
    }
    local_2c = '\x01';
    args_1 = comp->intType;
  }
  else {
    if (local_2c == '\0') {
      SVInt::resize((SVInt *)&local_28,(bitwidth_t)&local_38);
      local_28._0_14_ = auVar2;
      SVInt::operator=((SVInt *)&local_38,(SVInt *)&local_28);
      if (((0x40 < (uint)local_28.endLoc._0_4_) ||
          (((undefined1  [14])local_28._0_14_ & (undefined1  [14])0x10000000000) !=
           (undefined1  [14])0x0)) && (local_28.startLoc != (SourceLocation)0x0)) {
        operator_delete__((void *)local_28.startLoc);
      }
      local_2c = '\x01';
    }
    args_1 = Compilation::getType(comp,local_30,(bitmask<slang::ast::IntegralFlags>)0x1);
  }
  local_39 = true;
  local_28 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pIVar1 = BumpAllocator::
           emplace<slang::ast::IntegerLiteral,slang::ast::Compilation&,slang::ast::Type_const&,slang::SVInt,bool,slang::SourceRange>
                     (&comp->super_BumpAllocator,comp,args_1,(SVInt *)&local_38,&local_39,&local_28)
  ;
  if (((0x40 < local_30) || ((local_2b & 1) != 0)) && ((void *)local_38.val != (void *)0x0)) {
    operator_delete__(local_38.pVal);
  }
  return &pIVar1->super_Expression;
}

Assistant:

Expression& IntegerLiteral::fromSyntax(Compilation& comp, const LiteralExpressionSyntax& syntax) {
    SLANG_ASSERT(syntax.kind == SyntaxKind::IntegerLiteralExpression);

    const Type* type;
    SVInt val = syntax.literal.intValue();
    if (val.getBitWidth() < 32 || comp.languageVersion() < LanguageVersion::v1800_2023) {
        // In v2023 the rule changed to not truncate unsized literals.
        // Literals smaller than 32 bits are always sized up to 32.
        val = val.resize(32);
        val.setSigned(true);
        type = &comp.getIntType();
    }
    else {
        if (!val.isSigned()) {
            // Note the +1 here to account for the sign bit we're going to add.
            val = val.resize(val.getBitWidth() + 1);
            val.setSigned(true);
        }
        type = &comp.getType(val.getBitWidth(), IntegralFlags::Signed);
    }

    return *comp.emplace<IntegerLiteral>(comp, *type, std::move(val), true, syntax.sourceRange());
}